

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void dill_dealloc_specific(dill_stream_conflict s,dill_reg reg,int type,int class)

{
  byte bVar1;
  int class_local;
  int type_local;
  dill_reg reg_local;
  dill_stream_conflict s_local;
  
  bVar1 = (byte)reg;
  if (type == 9 || type == 10) {
    if (class == 0) {
      (s->p->var_f).avail[0] = (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & (s->p->var_f).avail[0]
      ;
      (s->p->var_f).mustsave[0] = 1L << (bVar1 & 0x3f) | (s->p->var_f).mustsave[0];
    }
    else {
      (s->p->tmp_f).avail[0] = (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & (s->p->tmp_f).avail[0]
      ;
    }
  }
  else if (class == 0) {
    (s->p->var_i).avail[0] = (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & (s->p->var_i).avail[0];
    (s->p->var_i).mustsave[0] = 1L << (bVar1 & 0x3f) | (s->p->var_i).mustsave[0];
  }
  else {
    (s->p->tmp_i).avail[0] = (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & (s->p->tmp_i).avail[0];
  }
  return;
}

Assistant:

extern void
dill_dealloc_specific(dill_stream s, dill_reg reg, int type, int class)
{
    switch (type) {
    case DILL_D:
    case DILL_F:
        if (class == DILL_VAR) {
            RESET_BIT(reg, s->p->var_f.avail);
            SET_BIT(reg, s->p->var_f.mustsave);
        } else {
            RESET_BIT(reg, s->p->tmp_f.avail);
        }
        break;
    default:
        if (class == DILL_VAR) {
            RESET_BIT(reg, s->p->var_i.avail);
            SET_BIT(reg, s->p->var_i.mustsave);
        } else {
            RESET_BIT(reg, s->p->tmp_i.avail);
        }
        break;
    }
}